

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O0

void __thiscall QUrl::setFragment(QUrl *this,QString *fragment,ParsingMode mode)

{
  bool bVar1;
  int in_EDX;
  QString *in_RSI;
  QUrlPrivate *in_RDI;
  QUrlPrivate *unaff_retaddr;
  QString *in_stack_ffffffffffffffd8;
  QUrlPrivate *pQVar2;
  Section section;
  
  pQVar2 = in_RDI;
  detach((QUrl *)in_RSI);
  section = (Section)((ulong)pQVar2 >> 0x38);
  QUrlPrivate::clearError((QUrlPrivate *)0x2fc9e2);
  QUrlPrivate::setFragment<QString_const&>(in_RDI,in_stack_ffffffffffffffd8,TolerantMode);
  bVar1 = QString::isNull((QString *)0x2fca02);
  if (bVar1) {
    *(byte *)(*(long *)in_RDI + 0xb8) = *(byte *)(*(long *)in_RDI + 0xb8) & 0x7f;
  }
  else if ((in_EDX == 1) &&
          (bVar1 = QUrlPrivate::validateComponent(unaff_retaddr,section,in_RSI), !bVar1)) {
    QString::clear((QString *)in_RDI);
  }
  return;
}

Assistant:

void QUrl::setFragment(const QString &fragment, ParsingMode mode)
{
    detach();
    d->clearError();

    d->setFragment(fragment, mode);
    if (fragment.isNull())
        d->sectionIsPresent &= ~QUrlPrivate::Fragment;
    else if (mode == StrictMode && !d->validateComponent(QUrlPrivate::Fragment, fragment))
        d->fragment.clear();
}